

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_epoch.h
# Opt level: O0

void __thiscall FASTER::core::LightEpoch::Drain(LightEpoch *this,uint64_t nextEpoch)

{
  ulong expected_epoch;
  bool bVar1;
  __int_type_conflict _Var2;
  __int_type _Var3;
  uint64_t trigger_epoch;
  uint32_t idx;
  uint64_t nextEpoch_local;
  LightEpoch *this_local;
  memory_order __b;
  
  ComputeNewSafeToReclaimEpoch(this,nextEpoch);
  trigger_epoch._4_4_ = 0;
  while( true ) {
    if (0xff < trigger_epoch._4_4_) {
      return;
    }
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    expected_epoch =
         this->drain_list_[trigger_epoch._4_4_].epoch.super___atomic_base<unsigned_long>._M_i;
    _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base *)&this->safe_to_reclaim_epoch);
    if (((expected_epoch <= _Var3) &&
        (bVar1 = EpochAction::TryPop(this->drain_list_ + trigger_epoch._4_4_,expected_epoch), bVar1)
        ) && (_Var2 = std::__atomic_base<unsigned_int>::operator--
                                (&(this->drain_count_).super___atomic_base<unsigned_int>),
             _Var2 == 0)) break;
    trigger_epoch._4_4_ = trigger_epoch._4_4_ + 1;
  }
  return;
}

Assistant:

void Drain(uint64_t nextEpoch) {
    ComputeNewSafeToReclaimEpoch(nextEpoch);
    for(uint32_t idx = 0; idx < kDrainListSize; ++idx) {
      uint64_t trigger_epoch = drain_list_[idx].epoch.load();
      if(trigger_epoch <= safe_to_reclaim_epoch) {
        if(drain_list_[idx].TryPop(trigger_epoch)) {
          if(--drain_count_ == 0) {
            break;
          }
        }
      }
    }
  }